

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

shared_ptr<mocker::ast::Type> __thiscall
mocker::Parser::type(Parser *this,TokIter *iter,TokIter end)

{
  long lVar1;
  TokIter TVar2;
  TokenID TVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TokIter TVar4;
  shared_ptr<mocker::ast::Type> sVar5;
  Position beg;
  Position end_00;
  GetTokenID id;
  Token *local_b8;
  TokIter aTStack_b0 [2];
  Parser *local_a0;
  Token *local_98;
  TokIter *local_90;
  Parser local_88;
  Parser local_68;
  size_t local_40;
  shared_ptr<mocker::ast::Type> *local_38;
  
  local_98 = *end._M_current;
  local_90 = iter;
  nonarrayType(&local_88,iter,end);
  TVar4._M_current = local_88.tokBeg._M_current;
  local_b8 = local_88.tokBeg._M_current;
  aTStack_b0[0]._M_current = local_88.tokEnd._M_current;
  local_88.tokBeg._M_current = (Token *)0x0;
  local_88.tokEnd._M_current = (Token *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.tokEnd);
  if (TVar4._M_current == (Token *)0x0) {
LAB_0016fd41:
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
  }
  else {
    TVar4._M_current = *end._M_current;
    local_a0 = this;
    while (TVar3 = GetTokenID::operator()((GetTokenID *)&local_68.pos,TVar4),
          TVar4._M_current = aTStack_b0[0]._M_current, TVar3 == LeftBracket) {
      lVar1 = *(long *)end._M_current;
      *(Token **)end._M_current = (Token *)(lVar1 + 0x38);
      TVar3 = GetTokenID::operator()((GetTokenID *)&local_68.pos,(Token *)(lVar1 + 0x38));
      if (TVar3 != RightBracket) {
        *(Token **)end._M_current = local_98;
        this = local_a0;
        goto LAB_0016fd41;
      }
      Token::position(local_98);
      TVar2._M_current = local_88.tokEnd._M_current;
      TVar4._M_current = local_88.tokBeg._M_current;
      Token::position(*end._M_current);
      beg.col = (size_t)TVar4._M_current;
      beg.line = (size_t)local_90;
      end_00.col = local_40;
      end_00.line = (size_t)TVar2._M_current;
      makeNode<mocker::ast::ArrayType,std::shared_ptr<mocker::ast::Type>&>
                (&local_68,beg,end_00,local_38);
      std::__shared_ptr<mocker::ast::Type,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<mocker::ast::Type,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
                 (__shared_ptr<mocker::ast::ArrayType,_(__gnu_cxx::_Lock_policy)2> *)&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68.tokEnd);
      TVar4._M_current = (Token *)(*(long *)end._M_current + 0x38);
      *(Token **)end._M_current = TVar4._M_current;
    }
    aTStack_b0[0]._M_current = (Token *)0x0;
    (local_a0->tokBeg)._M_current = local_b8;
    (local_a0->tokEnd)._M_current = TVar4._M_current;
    local_b8 = (Token *)0x0;
    this = local_a0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)aTStack_b0);
  sVar5.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Type>)
         sVar5.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Type> Parser::type(TokIter &iter, TokIter end) {
  auto beg = iter;
  std::shared_ptr<ast::Type> res = nonarrayType(iter, end);
  if (!res)
    return nullptr;

  auto id = GetTokenID(end);
  while (id(iter) == TokenID::LeftBracket) {
    ++iter;
    if (id(iter) != TokenID::RightBracket) {
      iter = beg;
      return nullptr;
    }
    res = makeNode<ast::ArrayType>(beg->position().first,
                                   iter->position().second, res);
    ++iter;
  }
  return res;
}